

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.cpp
# Opt level: O2

bool test(void)

{
  bool bVar1;
  bool bVar2;
  ostream *poVar3;
  byte bVar4;
  uint L;
  uint uVar5;
  int iVar6;
  bool bVar7;
  
  poVar3 = std::operator<<((ostream *)&std::cout,"Karp-Rabin");
  std::endl<char,std::char_traits<char>>(poVar3);
  bVar1 = true;
  iVar6 = 0x20;
  while (bVar7 = iVar6 != 0, iVar6 = iVar6 + -1, bVar7) {
    if (bVar1 == false) {
      return false;
    }
    bVar1 = isItAFunction<KarpRabinHash<unsigned_int,unsigned_char>>(7);
  }
  bVar7 = isItRandom<KarpRabinHash<unsigned_int,unsigned_char>>(0x13);
  bVar1 = (bool)(bVar1 & bVar7);
  iVar6 = 0x40;
  while (bVar7 = iVar6 != 0, iVar6 = iVar6 + -1, bVar7) {
    if (bVar1 == false) {
      return false;
    }
    bVar1 = isItAFunction<KarpRabinHash<unsigned_long_long,unsigned_char>>(7);
  }
  bVar7 = isItRandom<KarpRabinHash<unsigned_long_long,unsigned_char>>(0x13);
  if ((bVar1 & bVar7) == 1) {
    poVar3 = std::operator<<((ostream *)&std::cout,"cyclic");
    std::endl<char,std::char_traits<char>>(poVar3);
    bVar1 = true;
    for (uVar5 = 2; uVar5 != 0x21; uVar5 = uVar5 + 1) {
      if (bVar1 == false) {
        return false;
      }
      bVar7 = testExtendAndPrepend<CyclicHash<unsigned_int,unsigned_char>>(uVar5);
      bVar2 = isItAFunction<CyclicHash<unsigned_int,unsigned_char>>(uVar5);
      bVar1 = doesReverseUpdateWorks<CyclicHash<unsigned_int,unsigned_char>>(uVar5);
      bVar1 = bVar1 && (bVar2 && bVar7);
    }
    for (uVar5 = 2; uVar5 != 0x41; uVar5 = uVar5 + 1) {
      if (bVar1 == false) {
        return false;
      }
      bVar7 = testExtendAndPrepend<CyclicHash<unsigned_long_long,unsigned_char>>(uVar5);
      bVar1 = isItAFunction<CyclicHash<unsigned_long_long,unsigned_char>>(uVar5);
      bVar1 = bVar1 && bVar7;
    }
    bVar7 = isItRandom<CyclicHash<unsigned_int,unsigned_char>>(0x13);
    bVar2 = isItRandom<CyclicHash<unsigned_long_long,unsigned_char>>(0x13);
    bVar4 = bVar1 & (bVar2 && bVar7);
    poVar3 = std::operator<<((ostream *)&std::cout,"three-wise");
    std::endl<char,std::char_traits<char>>(poVar3);
    for (uVar5 = 1; uVar5 != 0x21; uVar5 = uVar5 + 1) {
      bVar1 = isItAFunction<ThreeWiseHash<unsigned_int,unsigned_char>>(uVar5);
      bVar4 = bVar4 & bVar1;
    }
    bVar1 = isItRandom<ThreeWiseHash<unsigned_int,unsigned_char>>(0x13);
    bVar4 = bVar4 & bVar1;
    for (uVar5 = 1; uVar5 != 0x41; uVar5 = uVar5 + 1) {
      bVar1 = isItAFunction<ThreeWiseHash<unsigned_long_long,unsigned_char>>(uVar5);
      bVar4 = bVar4 & bVar1;
    }
    bVar1 = isItRandom<ThreeWiseHash<unsigned_long_long,unsigned_char>>(0x13);
    poVar3 = std::operator<<((ostream *)&std::cout,"general");
    std::endl<char,std::char_traits<char>>(poVar3);
    bVar7 = isItAFunction<GeneralHash<0,unsigned_int,unsigned_char>>(9);
    if (((bVar4 & (bVar7 && bVar1)) != 0) &&
       (bVar1 = isItRandom<GeneralHash<0,unsigned_int,unsigned_char>>(0x13), bVar1)) {
      bVar1 = isItAFunction<GeneralHash<0,unsigned_int,unsigned_char>>(0x13);
      poVar3 = std::operator<<((ostream *)&std::cout,"general");
      std::endl<char,std::char_traits<char>>(poVar3);
      bVar7 = isItAFunction<GeneralHash<1,unsigned_int,unsigned_char>>(9);
      if ((bVar7 && bVar1) &&
         (bVar1 = isItRandom<GeneralHash<1,unsigned_int,unsigned_char>>(0x13), bVar1)) {
        bVar1 = isItAFunction<GeneralHash<1,unsigned_int,unsigned_char>>(0x13);
        return bVar1;
      }
    }
  }
  return false;
}

Assistant:

bool test() {
  bool ok(true);
  cout << "Karp-Rabin" << endl;
  for (uint L = 1; L <= 32; ++L) {
    if (!ok)
      return false;
    ok &= isItAFunction<KarpRabinHash<>>();
  }
  ok &= isItRandom<KarpRabinHash<>>();
  for (uint L = 1; L <= 64; ++L) {
    if (!ok)
      return false;
    ok &= isItAFunction<KarpRabinHash<uint64>>();
  }
  ok &= isItRandom<KarpRabinHash<uint64>>();
  if (!ok)
    return false;
  cout << "cyclic" << endl;
  for (uint L = 2; L <= 32; ++L) {
    if (!ok)
      return false;
    ok &= testExtendAndPrepend<CyclicHash<>>(L);
    ok &= isItAFunction<CyclicHash<>>(L);
    ok &= doesReverseUpdateWorks<CyclicHash<>>(L);
  }
  for (uint L = 2; L <= 64; ++L) {
    if (!ok)
      return false;
    ok &= testExtendAndPrepend<CyclicHash<uint64>>(L);
    ok &= isItAFunction<CyclicHash<uint64>>(L);
  }
  ok &= isItRandom<CyclicHash<>>();
  ok &= isItRandom<CyclicHash<uint64>>();

  cout << "three-wise" << endl;
  for (uint L = 1; L <= 32; ++L) {
    ok &= isItAFunction<ThreeWiseHash<>>(L);
  }
  ok &= isItRandom<ThreeWiseHash<>>();
  for (uint L = 1; L <= 64; ++L) {
    ok &= isItAFunction<ThreeWiseHash<uint64>>(L);
  }
  ok &= isItRandom<ThreeWiseHash<uint64>>();

  cout << "general" << endl;
  ok &= isItAFunction<GeneralHash<NOPRECOMP>>(9);
  if (!ok)
    return false;
  ok &= isItRandom<GeneralHash<NOPRECOMP>>();
  if (!ok)
    return false;
  ok &= isItAFunction<GeneralHash<NOPRECOMP>>(19);
  cout << "general" << endl;
  ok &= isItAFunction<GeneralHash<FULLPRECOMP>>(9);
  if (!ok)
    return false;
  ok &= isItRandom<GeneralHash<FULLPRECOMP>>();
  if (!ok)
    return false;
  ok &= isItAFunction<GeneralHash<FULLPRECOMP>>(19);
  return ok;
}